

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O0

CSVError *
duckdb::CSVError::HeaderSniffingError
          (CSVReaderOptions *options,vector<duckdb::HeaderValue,_true> *best_header_row,
          idx_t column_count,string *delimiter)

{
  LinesPerBoundary error_info_p;
  ulong uVar1;
  bool bVar2;
  undefined1 uVar3;
  ostream *poVar4;
  size_type sVar5;
  const_reference pvVar6;
  bool *pbVar7;
  ostream *poVar8;
  ulong in_RCX;
  vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_> *in_RDX;
  long in_RSI;
  CSVError *in_RDI;
  string *in_R8;
  idx_t i;
  ostringstream error;
  size_type in_stack_fffffffffffffcf8;
  vector<duckdb::HeaderValue,_true> *in_stack_fffffffffffffd00;
  undefined8 in_stack_fffffffffffffd20;
  CSVErrorType type_p;
  string *in_stack_fffffffffffffd28;
  CSVError *in_stack_fffffffffffffd30;
  ostream *in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd40;
  LinesPerBoundary local_1e8;
  string local_1d8 [32];
  ulong local_1b8;
  ostringstream local_1a0 [376];
  string *local_28;
  ulong local_20;
  vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_> *local_18;
  long local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  ::std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar4 = ::std::operator<<((ostream *)local_1a0,"Error when sniffing file \"");
  poVar4 = ::std::operator<<(poVar4,(string *)(local_10 + 0x270));
  poVar4 = ::std::operator<<(poVar4,"\".");
  ::std::operator<<(poVar4,'\n');
  poVar4 = ::std::operator<<((ostream *)local_1a0,
                             "It was not possible to detect the CSV Header, due to the header having less columns than expected"
                            );
  ::std::operator<<(poVar4,'\n');
  poVar4 = ::std::operator<<((ostream *)local_1a0,"Number of expected columns: ");
  poVar4 = (ostream *)::std::ostream::operator<<(poVar4,local_20);
  poVar4 = ::std::operator<<(poVar4,". Actual number of columns ");
  sVar5 = ::std::vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>::size(local_18);
  poVar4 = (ostream *)::std::ostream::operator<<(poVar4,sVar5);
  ::std::operator<<(poVar4,'\n');
  poVar4 = ::std::operator<<((ostream *)local_1a0,"Detected row as Header:");
  ::std::operator<<(poVar4,'\n');
  local_1b8 = 0;
  while( true ) {
    uVar1 = local_1b8;
    sVar5 = ::std::vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>::size(local_18)
    ;
    type_p = (CSVErrorType)((ulong)in_stack_fffffffffffffd20 >> 0x38);
    if (sVar5 <= uVar1) break;
    pvVar6 = vector<duckdb::HeaderValue,_true>::operator[]
                       (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    if ((pvVar6->is_null & 1U) == 0) {
      pvVar6 = vector<duckdb::HeaderValue,_true>::operator[]
                         (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      ::std::operator<<((ostream *)local_1a0,(string *)&pvVar6->value);
    }
    else {
      ::std::operator<<((ostream *)local_1a0,"NULL");
    }
    uVar1 = local_1b8;
    sVar5 = ::std::vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>::size(local_18)
    ;
    if (uVar1 < sVar5 - 1) {
      poVar4 = ::std::operator<<((ostream *)local_1a0,local_28);
      ::std::operator<<(poVar4," ");
    }
    local_1b8 = local_1b8 + 1;
  }
  ::std::operator<<((ostream *)local_1a0,anon_var_dwarf_3eb6436 + 8);
  poVar4 = ::std::operator<<((ostream *)local_1a0,"Possible fixes:");
  ::std::operator<<(poVar4,'\n');
  pbVar7 = CSVOption<bool>::GetValue((CSVOption<bool> *)(local_10 + 0x30));
  if ((*pbVar7 & 1U) != 0) {
    poVar4 = ::std::operator<<((ostream *)local_1a0,
                               "* Disable the parser\'s strict mode (strict_mode=false) to allow reading rows that do not comply with the CSV standard."
                              );
    ::std::operator<<(poVar4,'\n');
  }
  bVar2 = CSVOption<bool>::IsSetByUser((CSVOption<bool> *)(local_10 + 0x40));
  if (bVar2) {
    poVar4 = ::std::operator<<((ostream *)local_1a0,"* Header is set to \'");
    pbVar7 = CSVOption<bool>::GetValue((CSVOption<bool> *)(local_10 + 0x40));
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,(bool)(*pbVar7 & 1));
    poVar4 = ::std::operator<<(poVar4,"\'. Consider unsetting it.");
    ::std::operator<<(poVar4,'\n');
  }
  else {
    poVar4 = ::std::operator<<((ostream *)local_1a0,
                               "* Set header (header = true) if your CSV has a header, or (header = false) if it doesn\'t"
                              );
    ::std::operator<<(poVar4,'\n');
  }
  uVar3 = CSVOption<unsigned_long>::IsSetByUser((CSVOption<unsigned_long> *)(local_10 + 0x78));
  if ((bool)uVar3) {
    in_stack_fffffffffffffd30 =
         (CSVError *)::std::operator<<((ostream *)local_1a0,"* Skip is set to \'");
    in_stack_fffffffffffffd28 =
         (string *)CSVOption<unsigned_long>::GetValue((CSVOption<unsigned_long> *)(local_10 + 0x78))
    ;
    poVar4 = (ostream *)
             ::std::ostream::operator<<
                       (in_stack_fffffffffffffd30,*(ulong *)in_stack_fffffffffffffd28);
    poVar8 = ::std::operator<<(poVar4,"\'. Consider unsetting it.");
    type_p = (CSVErrorType)((ulong)poVar4 >> 0x38);
    ::std::operator<<(poVar8,'\n');
  }
  else {
    in_stack_fffffffffffffd38 =
         ::std::operator<<((ostream *)local_1a0,
                           "* Set skip (skip=${n}) to skip ${n} lines at the top of the file");
    ::std::operator<<(in_stack_fffffffffffffd38,'\n');
  }
  pbVar7 = CSVOption<bool>::GetValue((CSVOption<bool> *)(local_10 + 0x90));
  if ((*pbVar7 & 1U) == 0) {
    poVar4 = ::std::operator<<((ostream *)local_1a0,
                               "* Enable ignore errors (ignore_errors=true) to ignore potential errors"
                              );
    ::std::operator<<(poVar4,'\n');
  }
  if ((*(byte *)(local_10 + 0x2c0) & 1) == 0) {
    poVar4 = ::std::operator<<((ostream *)local_1a0,
                               "* Enable null padding (null_padding=true) to pad missing columns with NULL values"
                              );
    ::std::operator<<(poVar4,'\n');
  }
  ::std::__cxx11::ostringstream::str();
  LinesPerBoundary::LinesPerBoundary(&local_1e8);
  error_info_p.lines_in_batch._0_7_ = in_stack_fffffffffffffd40;
  error_info_p.boundary_idx = (idx_t)in_stack_fffffffffffffd38;
  error_info_p.lines_in_batch._7_1_ = uVar3;
  CSVError(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,type_p,error_info_p);
  ::std::__cxx11::string::~string(local_1d8);
  ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return in_RDI;
}

Assistant:

CSVError CSVError::HeaderSniffingError(const CSVReaderOptions &options, const vector<HeaderValue> &best_header_row,
                                       const idx_t column_count, const string &delimiter) {
	std::ostringstream error;
	// 1. Which file
	error << "Error when sniffing file \"" << options.file_path << "\"." << '\n';
	// 2. What's the error
	error << "It was not possible to detect the CSV Header, due to the header having less columns than expected"
	      << '\n';
	// 2.1 What's the expected number of columns
	error << "Number of expected columns: " << column_count << ". Actual number of columns " << best_header_row.size()
	      << '\n';
	// 2.2 What was the detected row
	error << "Detected row as Header:" << '\n';
	for (idx_t i = 0; i < best_header_row.size(); i++) {
		if (best_header_row[i].is_null) {
			error << "NULL";
		} else {
			error << best_header_row[i].value;
		}
		if (i < best_header_row.size() - 1) {
			error << delimiter << " ";
		}
	}
	error << "\n";

	// 3. Suggest how to fix it!
	error << "Possible fixes:" << '\n';
	if (options.dialect_options.state_machine_options.strict_mode.GetValue()) {
		error << "* Disable the parser's strict mode (strict_mode=false) to allow reading rows that do not comply with "
		         "the CSV standard."
		      << '\n';
	}
	// header
	if (!options.dialect_options.header.IsSetByUser()) {
		error << "* Set header (header = true) if your CSV has a header, or (header = false) if it doesn't" << '\n';
	} else {
		error << "* Header is set to \'" << options.dialect_options.header.GetValue() << "\'. Consider unsetting it."
		      << '\n';
	}
	// skip_rows
	if (!options.dialect_options.skip_rows.IsSetByUser()) {
		error << "* Set skip (skip=${n}) to skip ${n} lines at the top of the file" << '\n';
	} else {
		error << "* Skip is set to \'" << options.dialect_options.skip_rows.GetValue() << "\'. Consider unsetting it."
		      << '\n';
	}
	// ignore_errors
	if (!options.ignore_errors.GetValue()) {
		error << "* Enable ignore errors (ignore_errors=true) to ignore potential errors" << '\n';
	}
	// null_padding
	if (!options.null_padding) {
		error << "* Enable null padding (null_padding=true) to pad missing columns with NULL values" << '\n';
	}

	return CSVError(error.str(), SNIFFING, {});
}